

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>::
find<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry_const,capnp::Text::Reader&>
          (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks> *this,
          ArrayPtr<const_kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> table,
          Reader *params)

{
  ArrayPtr<const_kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> table_00;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  Entry *e;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar4;
  Entry *this_00;
  Reader *in_R8;
  Maybe<unsigned_long> MVar5;
  ulong local_68;
  HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks> *local_60;
  Entry *local_58;
  HashBucket *local_48;
  HashBucket *bucket;
  uint local_38;
  uint i;
  uint hashCode;
  Reader *params_local;
  HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks> *this_local;
  ArrayPtr<const_kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> table_local;
  
  this_local = (HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks> *)
               table.size_;
  this_00 = table.ptr;
  _hashCode = in_R8;
  params_local = (Reader *)this_00;
  table_local.ptr = (Entry *)params;
  table_local.size_ = (size_t)this;
  sVar3 = Array<kj::_::HashBucket>::size((Array<kj::_::HashBucket> *)&this_00->value);
  if (sVar3 == 0) {
    Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
    aVar4 = extraout_RDX;
  }
  else {
    uVar2 = HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks::
            hashCode<capnp::Text::Reader&>((Callbacks *)this_00,_hashCode);
    local_38 = uVar2;
    sVar3 = Array<kj::_::HashBucket>::size((Array<kj::_::HashBucket> *)&this_00->value);
    bucket._4_4_ = kj::_::chooseBucket(uVar2,(uint)sVar3);
    while( true ) {
      local_48 = Array<kj::_::HashBucket>::operator[]
                           ((Array<kj::_::HashBucket> *)&this_00->value,(ulong)bucket._4_4_);
      bVar1 = kj::_::HashBucket::isEmpty(local_48);
      if (bVar1) break;
      bVar1 = kj::_::HashBucket::isErased(local_48);
      if ((!bVar1) && (local_48->hash == local_38)) {
        local_60 = this_local;
        local_58 = table_local.ptr;
        table_00.size_ = (size_t)table_local.ptr;
        table_00.ptr = (Entry *)this_local;
        e = kj::_::HashBucket::getRow<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry>
                      (local_48,table_00);
        bVar1 = HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks::
                matches<capnp::Text::Reader&>((Callbacks *)this_00,e,_hashCode);
        if (bVar1) {
          uVar2 = kj::_::HashBucket::getPos(local_48);
          local_68 = (ulong)uVar2;
          Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_68);
          aVar4 = extraout_RDX_01;
          goto LAB_00274ea3;
        }
      }
      sVar3 = kj::_::probeHash((Array<kj::_::HashBucket> *)&this_00->value,(ulong)bucket._4_4_);
      bucket._4_4_ = (uint)sVar3;
    }
    Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
    aVar4 = extraout_RDX_00;
  }
LAB_00274ea3:
  MVar5.ptr.field_1.value = aVar4.value;
  MVar5.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar5.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }